

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O2

void __thiscall helics::TimeData::TimeData(TimeData *this)

{
  (this->next).internalTimeCode = -1;
  (this->Te).internalTimeCode = 0;
  (this->minDe).internalTimeCode = 0;
  (this->TeAlt).internalTimeCode = 0;
  (this->lastGrant).internalTimeCode = 0;
  this->minFed = -2010000000;
  this->minFedActual = -2010000000;
  this->mTimeState = initialized;
  this->hasData = false;
  this->interrupted = false;
  this->delayedTiming = false;
  this->timingVersion = -2;
  this->restrictionLevel = '\0';
  this->timeoutCount = 0;
  this->sequenceCounter = 0;
  this->responseSequenceCounter = 0;
  this->grantedIteration = 0;
  return;
}

Assistant:

TimeData() = default;